

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_ecf33::ArchiveTool::createCommand(ArchiveTool *this,StringRef name)

{
  unique_ptr<(anonymous_namespace)::ArchiveShellCommand,_std::default_delete<(anonymous_namespace)::ArchiveShellCommand>_>
  local_30;
  char *local_28;
  ArchiveTool *this_local;
  StringRef name_local;
  
  this_local = (ArchiveTool *)name.Length;
  local_28 = name.Data;
  name_local.Length = (size_t)this;
  llvm::make_unique<(anonymous_namespace)::ArchiveShellCommand,llvm::StringRef&>
            ((llvm *)&local_30,(StringRef *)&this_local);
  std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
  ::
  unique_ptr<(anonymous_namespace)::ArchiveShellCommand,std::default_delete<(anonymous_namespace)::ArchiveShellCommand>,void>
            ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
              *)this,&local_30);
  std::
  unique_ptr<(anonymous_namespace)::ArchiveShellCommand,_std::default_delete<(anonymous_namespace)::ArchiveShellCommand>_>
  ::~unique_ptr(&local_30);
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    return llvm::make_unique<ArchiveShellCommand>(name);
  }